

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

PerThreadSynch * absl::Skip(PerThreadSynch *x)

{
  PerThreadSynch *pPVar1;
  PerThreadSynch *pPVar2;
  PerThreadSynch *local_28;
  PerThreadSynch *x2;
  PerThreadSynch *x1;
  PerThreadSynch *x0;
  PerThreadSynch *x_local;
  
  local_28 = x->skip;
  x2 = x;
  if (local_28 != (PerThreadSynch *)0x0) {
    while( true ) {
      pPVar2 = x2;
      x2 = local_28;
      pPVar1 = local_28->skip;
      if (pPVar1 == (PerThreadSynch *)0x0) break;
      pPVar2->skip = pPVar1;
      local_28 = pPVar1;
    }
    x->skip = local_28;
  }
  return x2;
}

Assistant:

static PerThreadSynch *Skip(PerThreadSynch *x) {
  PerThreadSynch *x0 = nullptr;
  PerThreadSynch *x1 = x;
  PerThreadSynch *x2 = x->skip;
  if (x2 != nullptr) {
    // Each iteration attempts to advance sequence (x0,x1,x2) to next sequence
    // such that   x1 == x0->skip && x2 == x1->skip
    while ((x0 = x1, x1 = x2, x2 = x2->skip) != nullptr) {
      x0->skip = x2;      // short-circuit skip from x0 to x2
    }
    x->skip = x1;         // short-circuit skip from x to result
  }
  return x1;
}